

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_RunLengthDecode.hh
# Opt level: O0

Pipeline * __thiscall SF_RunLengthDecode::getDecodePipeline(SF_RunLengthDecode *this,Pipeline *next)

{
  element_type *peVar1;
  shared_ptr<Pl_RunLength> local_28;
  Pipeline *local_18;
  Pipeline *next_local;
  SF_RunLengthDecode *this_local;
  
  local_18 = next;
  next_local = (Pipeline *)this;
  std::make_shared<Pl_RunLength,char_const(&)[17],Pipeline*&,Pl_RunLength::action_e>
            ((char (*) [17])&local_28,(Pipeline **)"runlength decode",(action_e *)&local_18);
  std::shared_ptr<Pipeline>::operator=(&this->pipeline,&local_28);
  std::shared_ptr<Pl_RunLength>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  return peVar1;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline =
            std::make_shared<Pl_RunLength>("runlength decode", next, Pl_RunLength::a_decode);
        return this->pipeline.get();
    }